

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::AcesInputFile::readPixels(AcesInputFile *this,int scanLine1,int scanLine2)

{
  Data *pDVar1;
  Rgba *this_00;
  int x;
  int iVar2;
  ulong uVar3;
  V3f aces;
  Vec3<float> local_58;
  float local_4c;
  float local_48;
  float local_44;
  long local_40;
  long local_38;
  
  RgbaInputFile::readPixels(this->_data->rgbaFile,scanLine1,scanLine2);
  pDVar1 = this->_data;
  if (pDVar1->mustConvertColor == true) {
    iVar2 = scanLine1;
    if (scanLine2 < scanLine1) {
      iVar2 = scanLine2;
      scanLine2 = scanLine1;
    }
    local_40 = (long)scanLine2;
    for (local_38 = (long)iVar2; local_38 <= local_40; local_38 = local_38 + 1) {
      uVar3 = (ulong)pDVar1->minX;
      this_00 = pDVar1->fbBase + uVar3 * pDVar1->fbXStride + pDVar1->fbYStride * local_38;
      for (; (int)uVar3 <= pDVar1->maxX; uVar3 = (ulong)((int)uVar3 + 1)) {
        local_58.x = *(float *)(_imath_half_to_float_table + (ulong)(this_00->r)._h * 4);
        local_58.y = *(float *)(_imath_half_to_float_table + (ulong)(this_00->g)._h * 4);
        local_58.z = *(float *)(_imath_half_to_float_table + (ulong)(this_00->b)._h * 4);
        Imath_3_2::operator*(&local_58,&pDVar1->fileToAces);
        Imath_3_2::half::operator=(&this_00->r,local_4c);
        Imath_3_2::half::operator=(&this_00->g,local_48);
        Imath_3_2::half::operator=(&this_00->b,local_44);
        pDVar1 = this->_data;
        this_00 = this_00 + pDVar1->fbXStride;
      }
    }
  }
  return;
}

Assistant:

void
AcesInputFile::readPixels (int scanLine1, int scanLine2)
{
    //
    // Copy the pixels from the RgbaInputFile into the frame buffer.
    //

    _data->rgbaFile->readPixels (scanLine1, scanLine2);

    //
    // If the RGB space of the input file is not the same as the ACES
    // RGB space, then the pixels in the frame buffer must be transformed
    // into the ACES RGB space.
    //

    if (!_data->mustConvertColor) return;

    int minY = min (scanLine1, scanLine2);
    int maxY = max (scanLine1, scanLine2);

    for (int y = minY; y <= maxY; ++y)
    {
        Rgba* base = _data->fbBase + _data->fbXStride * _data->minX +
                     _data->fbYStride * y;

        for (int x = _data->minX; x <= _data->maxX; ++x)
        {
            V3f aces = V3f (base->r, base->g, base->b) * _data->fileToAces;

            base->r = aces[0];
            base->g = aces[1];
            base->b = aces[2];

            base += _data->fbXStride;
        }
    }
}